

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboRepeatedClearSampleTex2DCase::render
          (FboRepeatedClearSampleTex2DCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  DataType outputType;
  deUint32 program;
  Context *pCVar3;
  int i;
  long lVar4;
  int cellX;
  int iVar5;
  int ndx;
  int iVar6;
  float fVar7;
  deUint32 textures [2];
  TextureFormat fboFormat;
  Random rnd;
  Vec4 color;
  deUint32 fbos [2];
  Vec4 local_238;
  Surface *local_220;
  undefined1 *local_214;
  float local_20c;
  TextureFormatInfo fmtInfo;
  Texture2DShader fboBlitShader;
  
  fboFormat = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&fboFormat);
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  color.m_data[0] = (float)glu::getSampler2DType(fboFormat);
  if (rnd.m_rnd._8_8_ == 0) {
    std::vector<glu::DataType,std::allocator<glu::DataType>>::
    _M_realloc_insert<glu::DataType_const&>
              ((vector<glu::DataType,std::allocator<glu::DataType>> *)&rnd,(iterator)0x0,
               (DataType *)&color);
  }
  else {
    *(float *)rnd.m_rnd._8_8_ = color.m_data[0];
    rnd.m_rnd._8_8_ = rnd.m_rnd._8_8_ + 4;
  }
  outputType = FboTestUtil::getFragmentOutputType(&fboFormat);
  lVar4 = 0;
  do {
    color.m_data[lVar4] = 1.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_238.m_data[2] = 0.0;
  local_238.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&fboBlitShader,(DataTypes *)&rnd,outputType,&color,&local_238);
  if (rnd.m_rnd._0_8_ != 0) {
    operator_delete((void *)rnd.m_rnd._0_8_,-rnd.m_rnd._0_8_);
  }
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar3 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar3->_vptr_Context[0x75])(pCVar3,&fboBlitShader);
  deRandom_init(&rnd.m_rnd,0x1153f3e);
  fbos[0] = 0;
  fbos[1] = 0;
  textures[0] = 0;
  textures[1] = 0;
  sglr::ContextWrapper::glGenFramebuffers(this_00,2,fbos);
  sglr::ContextWrapper::glGenTextures(this_00,2,textures);
  lVar4 = 0;
  do {
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,*(deUint32 *)((long)textures + lVar4));
    sglr::ContextWrapper::glTexStorage2D
              (this_00,0xde1,1,(this->super_FboColorbufferCase).m_format,
               *(int *)((long)&DAT_01c1abe8 + lVar4),*(int *)((long)&DAT_01c1abe8 + lVar4));
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    FboTestCase::checkError((FboTestCase *)this);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*(deUint32 *)((long)fbos + lVar4));
    sglr::ContextWrapper::glFramebufferTexture2D
              (this_00,0x8d40,0x8ce0,0xde1,*(deUint32 *)((long)textures + lVar4),0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    lVar4 = lVar4 + 4;
  } while (lVar4 == 4);
  color.m_data[0] = 0.0;
  color.m_data[1] = 0.0;
  color.m_data[2] = 0.0;
  color.m_data[3] = 0.0;
  FboTestCase::clearColorBuffer((FboTestCase *)this,&fboFormat,&color);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&fboBlitShader,pCVar3,program);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,textures[0]);
  iVar6 = 0;
  local_220 = dst;
  do {
    iVar5 = 0;
    do {
      color.m_data[0] = 0.0;
      color.m_data[1] = 0.0;
      color.m_data[2] = 0.0;
      color.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        fVar1 = fmtInfo.valueMin.m_data[lVar4];
        fVar2 = fmtInfo.valueMax.m_data[lVar4];
        fVar7 = deRandom_getFloat(&rnd.m_rnd);
        color.m_data[lVar4] = (fVar2 - fVar1) * fVar7 + fVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbos[0]);
      FboTestCase::clearColorBuffer((FboTestCase *)this,&fboFormat,&color);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbos[1]);
      sglr::ContextWrapper::glViewport(this_00,iVar5 << 4,iVar6 << 4,0x10,0x10);
      pCVar3 = sglr::ContextWrapper::getCurrentContext(this_00);
      local_238.m_data[0] = -1.0;
      local_238.m_data[1] = -1.0;
      local_238.m_data._8_8_ = local_238.m_data._8_8_ & 0xffffffff00000000;
      local_214 = &DAT_3f8000003f800000;
      local_20c = 0.0;
      sglr::drawQuad(pCVar3,program,(Vec3 *)&local_238,(Vec3 *)&local_214);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 4);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 4);
  FboTestCase::readPixels
            ((FboTestCase *)this,local_220,0,0,0x40,0x40,&fboFormat,&fmtInfo.lookupScale,
             &fmtInfo.lookupBias);
  FboTestCase::checkError((FboTestCase *)this);
  FboTestUtil::Texture2DShader::~Texture2DShader(&fboBlitShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const tcu::TextureFormat		fboFormat		= glu::mapGLInternalFormat(m_format);
		const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(fboFormat);
		const int						numRowsCols		= 4;
		const int						cellSize		= 16;
		const int						fboSizes[]		= { cellSize, cellSize*numRowsCols };

		Texture2DShader					fboBlitShader	(DataTypes() << glu::getSampler2DType(fboFormat), getFragmentOutputType(fboFormat), Vec4(1.0f), Vec4(0.0f));
		const deUint32					fboBlitShaderID	= getCurrentContext()->createProgram(&fboBlitShader);

		de::Random						rnd				(18169662);
		deUint32						fbos[]			= { 0, 0 };
		deUint32						textures[]		= { 0, 0 };

		glGenFramebuffers(2, &fbos[0]);
		glGenTextures(2, &textures[0]);

		for (int fboNdx = 0; fboNdx < DE_LENGTH_OF_ARRAY(fbos); fboNdx++)
		{
			glBindTexture(GL_TEXTURE_2D, textures[fboNdx]);
			glTexStorage2D(GL_TEXTURE_2D, 1, m_format, fboSizes[fboNdx], fboSizes[fboNdx]);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
			checkError();

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[fboNdx]);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textures[fboNdx], 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// larger fbo bound -- clear to transparent black
		clearColorBuffer(fboFormat, Vec4(0.0f));

		fboBlitShader.setUniforms(*getCurrentContext(), fboBlitShaderID);
		glBindTexture(GL_TEXTURE_2D, textures[0]);

		for (int cellY = 0; cellY < numRowsCols; cellY++)
		for (int cellX = 0; cellX < numRowsCols; cellX++)
		{
			const Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[0]);
			clearColorBuffer(fboFormat, color);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[1]);
			glViewport(cellX*cellSize, cellY*cellSize, cellSize, cellSize);
			sglr::drawQuad(*getCurrentContext(), fboBlitShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, fboSizes[1], fboSizes[1], fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}